

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

void deseason_ma(double *sig,int N,int s,double *oup)

{
  size_t __size;
  int iVar1;
  double *oup_00;
  void *__ptr;
  void *__ptr_00;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  
  oup_00 = (double *)malloc((long)N * 8);
  __size = (long)s * 8;
  __ptr = malloc(__size);
  __ptr_00 = malloc(__size);
  mafilter2(sig,N,s,oup_00);
  uVar4 = s - (s >> 0x1f);
  if ((uVar4 & 0xfffffffe) != s) {
    uVar4 = (s - (s + -1 >> 0x1f)) - 1;
  }
  iVar5 = (int)uVar4 >> 1;
  if (0 < s) {
    iVar6 = N + iVar5 * -2;
    uVar2 = (ulong)(uint)s;
    uVar7 = 0;
    do {
      dVar8 = NAN;
      if ((int)uVar7 < iVar6) {
        iVar1 = 0;
        dVar8 = 0.0;
        uVar3 = uVar7;
        do {
          dVar8 = (dVar8 + sig[(long)iVar5 + uVar3]) - oup_00[(long)iVar5 + uVar3];
          iVar1 = iVar1 + 1;
          uVar3 = uVar3 + (long)s;
        } while ((long)uVar3 < (long)iVar6);
        dVar8 = dVar8 / (double)iVar1;
      }
      *(double *)((long)__ptr + (long)((iVar5 + (int)uVar7) % s) * 8) = dVar8;
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar2);
    if (0 < s) {
      dVar8 = 0.0;
      uVar7 = 0;
      do {
        dVar8 = dVar8 + *(double *)((long)__ptr + uVar7 * 8);
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
      if (0 < s) {
        uVar7 = 0;
        do {
          *(double *)((long)__ptr_00 + uVar7 * 8) =
               *(double *)((long)__ptr + uVar7 * 8) - dVar8 / (double)s;
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
    }
  }
  if (0 < N) {
    uVar2 = 0;
    iVar5 = s;
    iVar6 = s;
    do {
      do {
        iVar5 = iVar5 - s;
      } while (s <= iVar5);
      oup[uVar2] = sig[uVar2] - *(double *)((long)__ptr_00 + (long)iVar5 * 8);
      uVar2 = uVar2 + 1;
      iVar5 = iVar6 + 1;
      iVar6 = iVar5;
    } while (uVar2 != (uint)N);
  }
  free(__ptr);
  free(__ptr_00);
  free(oup_00);
  return;
}

Assistant:

void deseason_ma(double *sig,int N,int s,double *oup) {
	double *mt,*w,*seas;
	int k,window,q,odd,jd,count,per,it;
	double temp,wi;
	
	window = s;
	mt = (double*) malloc(sizeof(double) * N);	
	w = (double*) malloc(sizeof(double) * window);	
	seas = (double*) malloc(sizeof(double) * window);
	
	mafilter2(sig,N,window,mt);
	odd = window - ((window/2) * 2);
	
	if (odd) {
		q = (window - 1 ) / 2; 
	} else {
		q = window / 2;
	}
	
	for(k = 0; k < window;++k) {
		jd = k;
		count = 0;
		temp = 0.0;
		while (jd < N - 2*q) {
			temp = temp + sig[q+jd]-mt[q+jd];
			count++;
			jd+=window;
		}
		per = k + q -((k+q)/window)*window;
		w[per] = temp/count;
	}
	
	temp = 0.0;
	for(k = 0; k < window;++k)  {
		temp += w[k];
	}
	wi = temp/window;
	
	for(k = 0; k < window;++k)  {
		seas[k] = w[k] - wi;
	}
	
	for(k = 0; k < N;++k) {
		it = k;
		while (it >= window) {
			it -= window;
		}
		oup[k] = sig[k] - seas[it];
	}
	
	free(w);
	free(seas);
	free(mt);
}